

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::QXCH(Sequencer *this,unsigned_short instruction)

{
  ushort address;
  unsigned_short word;
  unsigned_short word_00;
  ostream *poVar1;
  element_type *peVar2;
  unsigned_short q;
  unsigned_short mk;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  address = instruction & 0x3ff;
  poVar1 = std::operator<<((ostream *)&std::cout,"QXCH");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::oct);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,address);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  word = Memory::Read(peVar2,address,0);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  word_00 = Memory::Read(peVar2,2,0);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,address,word_00);
  peVar2 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar2,2,word);
  return;
}

Assistant:

void egc::Sequencer::QXCH (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "QXCH" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto q = m_Memory->Read(000002u);

    m_Memory->Write(k, q);
    m_Memory->Write(00002u, mk);
}